

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void Initialise(void)

{
  mapped_type *pmVar1;
  allocator<char> local_29;
  key_type local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-ccitt",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-rohc",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-cdma2000",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x9b;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-wcdma",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x9b;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-ebu",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x1d;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-i-code",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x1d;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-darc",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x39;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-dvb-s2",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0xd5;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-itu",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc8-maxim",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined1 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x31;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\0';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-ccitt",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"crc16-aug-ccitt",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-genibus",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-xmodem",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-mcrf4xx",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-riello",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-tms37157",&local_29)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-a",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-kermit",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-x25",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1021;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-buypass",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x8005;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-dds-110",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x8005;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-arc",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x8005;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-maxim",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x8005;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-usb",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x8005;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-modbus",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x8005;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-dect-r",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x589
  ;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-dect-x",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0x589
  ;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-en-13757",&local_29)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x3d65;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-dnp",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x3d65;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-cdma2000",&local_29)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0xc867;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc16-teledisk",&local_29)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined2 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0xa097;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x01';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-bzip2",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x4c11db7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-mpeg2",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x4c11db7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-posix",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x4c11db7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x4c11db7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-jamcrc",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x4c11db7;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = true;
  pmVar1->reflectOut = true;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-q",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x814141ab;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-xfr",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> = 0xaf;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-c",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0x1edc6f41;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc32-d",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  *(undefined4 *)
   &(pmVar1->polynomial).
    super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
    super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long> =
       0xa833982b;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x02';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"crc64-ecma",&local_29);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CrcParameters>_>_>
           ::operator[](&crcTypes_abi_cxx11_,&local_28);
  (pmVar1->polynomial).
  super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
  super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>._M_u =
       0x42f0e1eba9ea3693;
  *(__index_type *)
   ((long)&(pmVar1->polynomial).
           super__Variant_base<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_assign_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Move_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Copy_ctor_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>.
           super__Variant_storage_alias<unsigned_char,_unsigned_short,_unsigned_int,_unsigned_long>
   + 8) = '\x03';
  pmVar1->reflectIn = false;
  pmVar1->reflectOut = false;
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Initialise()
{
  crcTypes["crc8-ccitt"]    = { uint8_t(0x07), false, false };
  crcTypes["crc8-rohc"]     = { uint8_t(0x07), true,  true };
  crcTypes["crc8-cdma2000"] = { uint8_t(0x9B), false, false };
  crcTypes["crc8-wcdma"]    = { uint8_t(0x9B), true,  true };
  crcTypes["crc8-ebu"]      = { uint8_t(0x1D), true,  true };
  crcTypes["crc8-i-code"]   = { uint8_t(0x1D), false, false };
  crcTypes["crc8-darc"]     = { uint8_t(0x39), true,  true };
  crcTypes["crc8-dvb-s2"]   = { uint8_t(0xD5), false, false };
  crcTypes["crc8-itu"]      = { uint8_t(0x07), false, false };
  crcTypes["crc8-maxim"]    = { uint8_t(0x31), true,  true };

  crcTypes["crc16-ccitt"]     = { uint16_t(0x1021), false, false };
  crcTypes["crc16-aug-ccitt"] = { uint16_t(0x1021), false, false };
  crcTypes["crc16-genibus"]   = { uint16_t(0x1021), false, false };
  crcTypes["crc16-xmodem"]    = { uint16_t(0x1021), false, false };
  crcTypes["crc16-mcrf4xx"]   = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-riello"]    = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-tms37157"]  = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-a"]         = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-kermit"]    = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-x25"]       = { uint16_t(0x1021), true,  true };
  crcTypes["crc16-buypass"]   = { uint16_t(0x8005), false, false };
  crcTypes["crc16-dds-110"]   = { uint16_t(0x8005), false, false };
  crcTypes["crc16-arc"]       = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-maxim"]     = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-usb"]       = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-modbus"]    = { uint16_t(0x8005), true,  true };
  crcTypes["crc16-dect-r"]    = { uint16_t(0x0589), false, false };
  crcTypes["crc16-dect-x"]    = { uint16_t(0x0589), false, false };
  crcTypes["crc16-en-13757"]  = { uint16_t(0x3D65), false, false };
  crcTypes["crc16-dnp"]       = { uint16_t(0x3D65), true,  true };
  crcTypes["crc16-cdma2000"]  = { uint16_t(0xC867), false, false };
  crcTypes["crc16-teledisk"]  = { uint16_t(0xA097), false, false };

  crcTypes["crc32-bzip2"]  = { uint32_t(0x04C11DB7), false, false };
  crcTypes["crc32-mpeg2"]  = { uint32_t(0x04C11DB7), false, false };
  crcTypes["crc32-posix"]  = { uint32_t(0x04C11DB7), false, false };
  crcTypes["crc32"]        = { uint32_t(0x04C11DB7), true,  true };
  crcTypes["crc32-jamcrc"] = { uint32_t(0x04C11DB7), true,  true };
  crcTypes["crc32-q"]      = { uint32_t(0x814141AB), false, false };
  crcTypes["crc32-xfr"]    = { uint32_t(0x000000AF), false, false };
  crcTypes["crc32-c"]      = { uint32_t(0x1EDC6F41), false, false };
  crcTypes["crc32-d"]      = { uint32_t(0xA833982B), false, false };

  crcTypes["crc64-ecma"] = { uint64_t(0x42F0E1EBA9EA3693), false, false };
}